

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_false>_> __thiscall
immutable::rrb_details::execute_concat_plan<int,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_false>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  size_t sVar1;
  rrb_size_table<false> *prVar2;
  rrb_size_table<false> *prVar3;
  uint uVar4;
  undefined4 *puVar5;
  internal_node<int,_false> *piVar6;
  char *__function;
  uint uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_node;
  ref<immutable::rrb_details::leaf_node<int,_false>_> old;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_88;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_80;
  uint32_t local_78;
  uint local_74;
  undefined4 *local_70;
  ulong local_68;
  ref<immutable::rrb_details::internal_node<int,_false>_> *local_60;
  internal_node<int,_false> *local_58;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  ulong local_40;
  internal_node<int,_false> *local_38;
  
  local_50 = (ulong)slen;
  sVar1 = local_50 * 8;
  local_60 = all;
  local_48 = node_size;
  puVar5 = (undefined4 *)malloc(local_50 * 8 + 0x20);
  puVar5[1] = slen;
  *puVar5 = 1;
  *(undefined8 *)(puVar5 + 4) = 0;
  puVar5[3] = 0;
  *(undefined4 **)(puVar5 + 6) = puVar5 + 8;
  memset(puVar5 + 8,0,sVar1);
  *(undefined4 **)this = puVar5;
  puVar5[2] = 1;
  local_70 = puVar5;
  local_58 = (internal_node<int,_false> *)this;
  if (shift == 6) {
    if (slen != 0) {
      uVar14 = 0;
      uVar7 = 0;
      uVar13 = 0;
      local_78 = 6;
      do {
        if (local_60->ptr == (internal_node<int,_false> *)0x0) {
LAB_001473cc:
          __function = 
          "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
          ;
LAB_001473e1:
          __assert_fail("ptr != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                        ,0x71a,__function);
        }
        uVar15 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar14];
        uVar9 = (ulong)uVar15;
        local_80.ptr = local_60->ptr->child[uVar7].ptr;
        if (local_80.ptr == (internal_node<int,_false> *)0x0) {
          if (uVar13 == 0) {
LAB_001473eb:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
            ;
            goto LAB_001473e1;
          }
LAB_00146fd1:
          piVar6 = (internal_node<int,_false> *)malloc(uVar9 * 4 + 0x18);
          piVar6->len = uVar15;
          piVar6->type = LEAF_NODE;
          (piVar6->size_table).ptr = (rrb_size_table<false> *)&piVar6->child;
          piVar6->guid = 0;
          if (uVar15 == 0) {
            piVar6->_ref_count = 1;
            local_88.ptr = piVar6;
          }
          else {
            uVar12 = 0;
            memset(&piVar6->child,0,uVar9 * 4);
            piVar6->_ref_count = 1;
            local_88.ptr = piVar6;
            do {
              if (local_60->ptr == (internal_node<int,_false> *)0x0) goto LAB_001473cc;
              piVar6 = local_60->ptr->child[uVar7].ptr;
              if (piVar6 == (internal_node<int,_false> *)0x0) goto LAB_001473eb;
              piVar6->_ref_count = piVar6->_ref_count + 1;
              uVar11 = (uint)uVar12;
              uVar4 = uVar15 - uVar11;
              if (uVar4 < piVar6->len - uVar13) {
                if (uVar15 != uVar11) {
                  if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_001473eb;
                  prVar2 = (piVar6->size_table).ptr;
                  prVar3 = ((local_88.ptr)->size_table).ptr;
                  uVar10 = (ulong)uVar4;
                  uVar11 = uVar13;
                  do {
                    *(undefined4 *)((long)&prVar3->size + uVar12 * 4) =
                         *(undefined4 *)((long)&prVar2->size + (ulong)uVar11 * 4);
                    uVar12 = (ulong)((int)uVar12 + 1);
                    uVar11 = uVar11 + 1;
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                }
                uVar13 = uVar13 + uVar4;
                uVar12 = uVar9;
              }
              else {
                uVar4 = 0;
                if (piVar6->len != uVar13) {
                  if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_001473eb;
                  prVar2 = (piVar6->size_table).ptr;
                  prVar3 = ((local_88.ptr)->size_table).ptr;
                  uVar12 = 0;
                  do {
                    *(undefined4 *)((long)&prVar3->size + (ulong)(uVar11 + (int)uVar12) * 4) =
                         *(undefined4 *)((long)&prVar2->size + (ulong)(uVar13 + (int)uVar12) * 4);
                    uVar12 = uVar12 + 1;
                    uVar4 = piVar6->len - uVar13;
                  } while (uVar12 < uVar4);
                }
                uVar7 = uVar7 + 1;
                uVar13 = 0;
                uVar12 = (ulong)(uVar4 + uVar11);
              }
              uVar8 = piVar6->_ref_count;
              piVar6->_ref_count = uVar8 - 1;
              if (uVar8 == 1) {
                free(piVar6);
              }
            } while ((uint)uVar12 < uVar15);
          }
          ref<immutable::rrb_details::internal_node<int,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,false>> *)
                     (uVar14 * 8 + *(long *)(local_70 + 6)),
                     (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_88);
          if ((local_88.ptr != (internal_node<int,_false> *)0x0) &&
             (uVar8 = (local_88.ptr)->_ref_count, (local_88.ptr)->_ref_count = uVar8 - 1, uVar8 == 1
             )) {
            free(local_88.ptr);
          }
        }
        else {
          (local_80.ptr)->_ref_count = (local_80.ptr)->_ref_count + 1;
          if ((uVar13 != 0) || (uVar15 != (local_80.ptr)->len)) goto LAB_00146fd1;
          ref<immutable::rrb_details::internal_node<int,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,false>> *)
                     (uVar14 * 8 + *(long *)(local_70 + 6)),
                     (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_80);
          uVar7 = uVar7 + 1;
          uVar13 = 0;
        }
        if ((local_80.ptr != (internal_node<int,_false> *)0x0) &&
           (uVar8 = (local_80.ptr)->_ref_count, (local_80.ptr)->_ref_count = uVar8 - 1, uVar8 == 1))
        {
          free(local_80.ptr);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_50);
    }
  }
  else if (slen != 0) {
    local_78 = shift - 6;
    uVar14 = 0;
    uVar7 = 0;
    uVar9 = 0;
    do {
      if (local_60->ptr == (internal_node<int,_false> *)0x0) goto LAB_001473cc;
      uVar13 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      local_68 = (ulong)uVar13;
      local_80.ptr = local_60->ptr->child[uVar7].ptr;
      if (local_80.ptr == (internal_node<int,_false> *)0x0) {
        if ((int)uVar9 == 0) goto LAB_001473cc;
LAB_001471fd:
        sVar1 = local_68 * 8;
        local_40 = uVar14;
        piVar6 = (internal_node<int,_false> *)malloc(local_68 * 8 + 0x20);
        piVar6->len = uVar13;
        piVar6->type = INTERNAL_NODE;
        (piVar6->size_table).ptr = (rrb_size_table<false> *)0x0;
        piVar6->guid = 0;
        piVar6->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar6 + 1);
        uVar14 = 0;
        memset(piVar6 + 1,0,sVar1);
        piVar6->_ref_count = 1;
        local_88.ptr = piVar6;
        while( true ) {
          uVar15 = (uint)uVar14;
          uVar13 = (uint)local_68 - uVar15;
          if ((uint)local_68 < uVar15 || uVar13 == 0) break;
          if ((local_60->ptr == (internal_node<int,_false> *)0x0) ||
             (piVar6 = local_60->ptr->child[uVar7].ptr, piVar6 == (internal_node<int,_false> *)0x0))
          goto LAB_001473cc;
          piVar6->_ref_count = piVar6->_ref_count + 1;
          uVar8 = (uint32_t)uVar9;
          local_74 = uVar7;
          if (uVar13 < piVar6->len - uVar8) {
            uVar12 = (ulong)uVar13;
            do {
              if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_001473cc;
              ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                        ((local_88.ptr)->child + uVar14,piVar6->child + uVar9);
              uVar14 = (ulong)((int)uVar14 + 1);
              uVar9 = (ulong)((int)uVar9 + 1);
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
            uVar9 = (ulong)(uVar13 + uVar8);
            uVar14 = local_68 & 0xffffffff;
            uVar7 = local_74;
          }
          else {
            uVar13 = 0;
            if (piVar6->len != uVar8) {
              uVar14 = 0;
              do {
                if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_001473cc;
                ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                          ((local_88.ptr)->child + (uVar15 + (int)uVar14),
                           piVar6->child + ((int)uVar14 + uVar8));
                uVar14 = uVar14 + 1;
                uVar13 = piVar6->len - uVar8;
              } while (uVar14 < uVar13);
            }
            uVar7 = local_74 + 1;
            uVar14 = (ulong)(uVar13 + uVar15);
            uVar9 = 0;
          }
          release<int>(piVar6);
        }
        set_sizes<int,false,6>((rrb_details *)&local_38,&local_88,local_78);
        uVar14 = local_40;
        release<int>(local_38);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   (uVar14 * 8 + *(long *)(local_70 + 6)),&local_88);
        release<int>(local_88.ptr);
      }
      else {
        (local_80.ptr)->_ref_count = (local_80.ptr)->_ref_count + 1;
        if (((int)uVar9 != 0) || (uVar13 != (local_80.ptr)->len)) goto LAB_001471fd;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   (uVar14 * 8 + *(long *)(local_70 + 6)),&local_80);
        uVar7 = uVar7 + 1;
        uVar9 = 0;
      }
      release<int>(local_80.ptr);
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_50);
  }
  return (ref<immutable::rrb_details::internal_node<int,_false>_>)local_58;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }